

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# message.cpp
# Opt level: O0

void __thiscall
booster::locale::gnu_gettext::message_key<char>::message_key(message_key<char> *this,string_type *c)

{
  string *in_RSI;
  string *in_RDI;
  size_t pos;
  string local_68 [32];
  string local_48 [48];
  long local_18;
  string *local_10;
  
  local_10 = in_RSI;
  std::__cxx11::string::string(in_RDI);
  std::__cxx11::string::string(in_RDI + 0x20);
  *(undefined8 *)(in_RDI + 0x40) = 0;
  *(undefined8 *)(in_RDI + 0x48) = 0;
  local_18 = std::__cxx11::string::find((char)local_10,4);
  if (local_18 == -1) {
    std::__cxx11::string::operator=(in_RDI + 0x20,local_10);
  }
  else {
    std::__cxx11::string::substr((ulong)local_48,(ulong)local_10);
    std::__cxx11::string::operator=(in_RDI,local_48);
    std::__cxx11::string::~string(local_48);
    std::__cxx11::string::substr((ulong)local_68,(ulong)local_10);
    std::__cxx11::string::operator=(in_RDI + 0x20,local_68);
    std::__cxx11::string::~string(local_68);
  }
  return;
}

Assistant:

message_key(string_type const &c = string_type()) :
                    c_context_(0),
                    c_key_(0)
                {
                    size_t pos = c.find(char_type(4));
                    if(pos == string_type::npos) {
                        key_ = c;
                    }
                    else {
                        context_ = c.substr(0,pos);
                        key_ = c.substr(pos+1);
                    }
                }